

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

vector * __thiscall lsh::vector::operator&(vector *__return_storage_ptr__,vector *this,vector *v)

{
  uint uVar1;
  uint uVar2;
  invalid_argument *this_00;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  uint local_50;
  allocator<unsigned_int> local_49;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> c;
  uint n;
  vector *v_local;
  vector *this_local;
  
  uVar1 = size(this);
  uVar2 = size(v);
  if (uVar1 != uVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->components_);
  c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (uint)sVar3;
  std::allocator<unsigned_int>::allocator(&local_49);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,sVar3 & 0xffffffff,&local_49)
  ;
  std::allocator<unsigned_int>::~allocator(&local_49);
  for (local_50 = 0;
      local_50 <
      (uint)c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage; local_50 = local_50 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->components_,(ulong)local_50);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&v->components_,(ulong)local_50);
    uVar2 = *pvVar4;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)local_50);
    *pvVar5 = uVar1 & uVar2;
  }
  vector(__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
         this->size_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

vector vector::operator&(const vector& v) const {
    if (this->size() != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->components_.size();

    std::vector<unsigned int> c(n);

    for (unsigned int i = 0; i < n; i++) {
      c[i] = this->components_[i] & v.components_[i];
    }

    return vector(c, this->size_);
  }